

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

string * __thiscall
cmSystemTools::EscapeWindowsShellArgument_abi_cxx11_
          (string *__return_storage_ptr__,cmSystemTools *this,char *arg,int shell_flags)

{
  char **ppcVar1;
  allocator local_436;
  undefined1 local_435;
  int local_434;
  char **ppcStack_430;
  int size;
  char *buffer;
  char local_buffer [1024];
  int shell_flags_local;
  char *arg_local;
  string *result;
  
  ppcStack_430 = &buffer;
  local_434 = cmsysSystem_Shell_GetArgumentSizeForWindows((char *)this,(int)arg);
  if (0x400 < local_434) {
    ppcStack_430 = (char **)operator_new__((long)local_434);
  }
  cmsysSystem_Shell_GetArgumentForWindows((char *)this,(char *)ppcStack_430,(int)arg);
  ppcVar1 = ppcStack_430;
  local_435 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)ppcVar1,&local_436);
  std::allocator<char>::~allocator((allocator<char> *)&local_436);
  if ((ppcStack_430 != &buffer) && (ppcStack_430 != (char **)0x0)) {
    operator_delete__(ppcStack_430);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmSystemTools::EscapeWindowsShellArgument(const char* arg,
                                                      int shell_flags)
{
  char local_buffer[1024];
  char* buffer = local_buffer;
  int size = cmsysSystem_Shell_GetArgumentSizeForWindows(arg, shell_flags);
  if(size > 1024)
    {
    buffer = new char[size];
    }
  cmsysSystem_Shell_GetArgumentForWindows(arg, buffer, shell_flags);
  std::string result(buffer);
  if(buffer != local_buffer)
    {
    delete [] buffer;
    }
  return result;
}